

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotetrahedra.h
# Opt level: O0

void pzgeom::TPZGeoTetrahedra::X<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  int iVar2;
  int64_t iVar3;
  TPZFMatrix<double> *this;
  double *pdVar4;
  TPZVec<double> *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<12,_double> dphi;
  TPZFNMatrix<4,_double> phi;
  double in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  TPZFNMatrix<12,_double> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe20;
  int iVar5;
  undefined4 in_stack_fffffffffffffe24;
  int iVar6;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  TPZVec<double> *in_stack_fffffffffffffe30;
  
  TPZFNMatrix<4,_double>::TPZFNMatrix
            ((TPZFNMatrix<4,_double> *)in_stack_fffffffffffffe10,(int64_t)in_stack_fffffffffffffe08,
             (int64_t)in_stack_fffffffffffffe00);
  TPZFNMatrix<12,_double>::TPZFNMatrix
            (in_stack_fffffffffffffe10,(int64_t)in_stack_fffffffffffffe08,
             (int64_t)in_stack_fffffffffffffe00);
  pztopology::TPZTetrahedron::TShape<double>
            (in_stack_fffffffffffffe30,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  iVar2 = (int)iVar3;
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    this = (TPZFMatrix<double> *)TPZVec<double>::operator[](in_RDX,(long)iVar6);
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
      in_stack_fffffffffffffe08 =
           TPZFMatrix<double>::operator()
                     (this,(int64_t)in_stack_fffffffffffffe08,(int64_t)in_stack_fffffffffffffe00);
      dVar1 = *in_stack_fffffffffffffe08;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)iVar6,(long)iVar5);
      in_stack_fffffffffffffe00 = extraout_XMM0_Qa;
      pdVar4 = TPZVec<double>::operator[](in_RDX,(long)iVar6);
      *pdVar4 = dVar1 * in_stack_fffffffffffffe00 + *pdVar4;
    }
  }
  TPZFNMatrix<12,_double>::~TPZFNMatrix((TPZFNMatrix<12,_double> *)0x1617e4e);
  TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1617e5b);
  return;
}

Assistant:

inline void TPZGeoTetrahedra::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<12,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < NNodes; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }